

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O0

void __thiscall
eos::render::Rasterizer<eos::render::TexturingFragmentShader>::raster_triangle<float>
          (Rasterizer<eos::render::TexturingFragmentShader> *this,Vertex<float> *point_a,
          Vertex<float> *point_b,Vertex<float> *point_c,optional<eos::render::Texture> *texture)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  CoeffReturnType pfVar18;
  CoeffReturnType pfVar19;
  CoeffReturnType pfVar20;
  CoeffReturnType pfVar21;
  CoeffReturnType pfVar22;
  double *pdVar23;
  Texture *pTVar24;
  const_reference pvVar25;
  Scalar *pSVar26;
  float *pfVar27;
  Pixel<unsigned_char,_4> *pPVar28;
  uchar *puVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float x_00;
  float y_00;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  __type_conflict _Var37;
  float local_248;
  uchar local_241;
  float local_240;
  uchar alpha_1;
  float local_238;
  uchar blue;
  float local_230;
  uchar green;
  undefined1 local_228 [7];
  uchar red;
  Matrix<float,_4,_1,_0,_4,_1> local_218;
  float local_208;
  float local_204;
  float dvdy;
  float dvdx;
  float dudy;
  float dudx;
  float one_over_squared_one_over_z;
  float one_over_z;
  float v_over_z;
  float u_over_z;
  Vector4<float> pixel_color;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  undefined1 local_1c4 [8];
  Vector3<float> lambda;
  double d;
  bool passes_depth_test;
  bool draw;
  double z_affine;
  int pixel_index_col;
  int pixel_index_row;
  double gamma;
  double beta;
  double alpha;
  double one_over_v2ToLine01;
  double one_over_v1ToLine20;
  double one_over_v0ToLine12;
  float y;
  float x;
  int xi;
  int yi;
  float gamma_ffy;
  float beta_ffy;
  float alpha_ffy;
  float gamma_ffx;
  float beta_ffx;
  float alpha_ffx;
  float one_over_gamma_c;
  float one_over_beta_c;
  float one_over_alpha_c;
  Matrix<float,_3,_1,_0,_3,_1> local_128;
  Matrix<float,_3,_1,_0,_3,_1> local_11c;
  undefined1 local_110 [8];
  plane gamma_plane;
  float local_f0;
  Matrix<float,_3,_1,_0,_3,_1> local_ec;
  float local_e0;
  Matrix<float,_3,_1,_0,_3,_1> local_dc;
  undefined1 local_d0 [8];
  plane beta_plane;
  float local_b0;
  Matrix<float,_3,_1,_0,_3,_1> local_ac;
  float local_a0;
  Matrix<float,_3,_1,_0,_3,_1> local_9c;
  undefined1 local_90 [8];
  plane alpha_plane;
  float *one_over_w2;
  float *one_over_w1;
  float *one_over_w0;
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  Vector2<float> local_50;
  Vector2<float> local_48;
  undefined1 local_40 [8];
  Rect<int> boundingBox;
  optional<eos::render::Texture> *texture_local;
  Vertex<float> *point_c_local;
  Vertex<float> *point_b_local;
  Vertex<float> *point_a_local;
  Rasterizer<eos::render::TexturingFragmentShader> *this_local;
  
  boundingBox._8_8_ = texture;
  pfVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::x
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a);
  pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a);
  Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
            ((Matrix<float,2,1,0,2,1> *)&local_48,pfVar18,pfVar19);
  pfVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::x
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b);
  pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b);
  Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
            ((Matrix<float,2,1,0,2,1> *)&local_50,pfVar18,pfVar19);
  pfVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::x
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c);
  pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c);
  Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
            ((Matrix<float,2,1,0,2,1> *)&max_x,pfVar18,pfVar19);
  _local_40 = detail::calculate_clipped_bounding_box<float>
                        (&local_48,&local_50,(Vector2<float> *)&max_x,this->viewport_width,
                         this->viewport_height);
  uVar7 = local_40._0_4_;
  iVar9 = local_40._0_4_ + boundingBox.x;
  iVar10 = local_40._4_4_ + boundingBox.y;
  pfVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,3);
  pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,3);
  alpha_plane._8_8_ =
       Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                 ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,3);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,1);
  pfVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                       &point_a->texcoords,0);
  local_a0 = *pfVar22 * *pfVar18;
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_9c,pfVar20,pfVar21,&local_a0);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,1);
  pfVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                       &point_b->texcoords,0);
  local_b0 = *pfVar22 * *pfVar19;
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_ac,pfVar20,pfVar21,&local_b0);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,1);
  pfVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                       &point_c->texcoords,0);
  beta_plane.c = *pfVar22 * *(float *)alpha_plane._8_8_;
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)&beta_plane.d,pfVar20,pfVar21,&beta_plane.c);
  detail::plane::plane<float>((plane *)local_90,&local_9c,&local_ac,(Vector3<float> *)&beta_plane.d)
  ;
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,1);
  pfVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                       &point_a->texcoords,1);
  local_e0 = *pfVar22 * *pfVar18;
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_dc,pfVar20,pfVar21,&local_e0);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,1);
  pfVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                       &point_b->texcoords,1);
  local_f0 = *pfVar22 * *pfVar19;
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_ec,pfVar20,pfVar21,&local_f0);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,1);
  pfVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                       &point_c->texcoords,1);
  gamma_plane.c = *pfVar22 * *(float *)alpha_plane._8_8_;
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)&gamma_plane.d,pfVar20,pfVar21,&gamma_plane.c);
  detail::plane::plane<float>
            ((plane *)local_d0,&local_dc,&local_ec,(Vector3<float> *)&gamma_plane.d);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,1);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_11c,pfVar20,pfVar21,pfVar18);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,1);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_128,pfVar20,pfVar21,pfVar19);
  pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,0);
  pfVar21 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,1);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)&one_over_beta_c,pfVar20,pfVar21,
             (Scalar *)alpha_plane._8_8_);
  detail::plane::plane<float>
            ((plane *)local_110,&local_11c,&local_128,(Vector3<float> *)&one_over_beta_c);
  fVar30 = 1.0 / alpha_plane.a;
  fVar31 = 1.0 / beta_plane.a;
  fVar32 = 1.0 / gamma_plane.a;
  fVar11 = -(float)local_90._0_4_;
  fVar12 = -(float)local_d0._0_4_;
  fVar13 = -(float)local_110._0_4_;
  fVar14 = -(float)local_90._4_4_;
  fVar15 = -(float)local_d0._4_4_;
  fVar16 = -(float)local_110._4_4_;
  for (x = (float)local_40._4_4_; (int)x <= iVar10; x = (float)((int)x + 1)) {
    for (y = (float)uVar7; (int)y <= iVar9; y = (float)((int)y + 1)) {
      x_00 = (float)(int)y + 0.5;
      y_00 = (float)(int)x + 0.5;
      pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,0);
      fVar1 = *pfVar20;
      pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,1);
      dVar33 = detail::implicit_line<float>(fVar1,*pfVar20,&point_b->position,&point_c->position);
      pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,0);
      fVar1 = *pfVar20;
      pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,1);
      dVar34 = detail::implicit_line<float>(fVar1,*pfVar20,&point_c->position,&point_a->position);
      pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,0);
      fVar1 = *pfVar20;
      pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,1);
      dVar35 = detail::implicit_line<float>(fVar1,*pfVar20,&point_a->position,&point_b->position);
      dVar36 = detail::implicit_line<float>(x_00,y_00,&point_b->position,&point_c->position);
      beta = dVar36 * (1.0 / dVar33);
      dVar33 = detail::implicit_line<float>(x_00,y_00,&point_c->position,&point_a->position);
      gamma = dVar33 * (1.0 / dVar34);
      _pixel_index_col =
           detail::implicit_line<float>(x_00,y_00,&point_a->position,&point_b->position);
      _pixel_index_col = _pixel_index_col * (1.0 / dVar35);
      if (((0.0 <= beta) && (0.0 <= gamma)) && (0.0 <= _pixel_index_col)) {
        pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_a,2);
        fVar1 = *pfVar20;
        pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_b,2);
        fVar2 = *pfVar20;
        pfVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> *)point_c,2);
        dVar33 = _pixel_index_col * (double)*pfVar20 + beta * (double)fVar1 + gamma * (double)fVar2;
        bVar8 = this->enable_far_clipping;
        bVar3 = false;
        if ((this->enable_depth_test & 1U) != 0) {
          pdVar23 = core::Image<double>::operator()(&this->depthbuffer,(int)x,(int)y);
          bVar3 = dVar33 < *pdVar23;
        }
        if (((bVar3) && ((bVar8 & 1U) == 0 || dVar33 <= 1.0)) ||
           ((this->enable_depth_test & 1U) == 0)) {
          if ((this->perspective_correct_barycentric_weights & 1U) != 0) {
            lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array._4_8_ = 1.0 / (_pixel_index_col * (double)*(float *)alpha_plane._8_8_ +
                                beta * (double)*pfVar18 + gamma * (double)*pfVar19);
            beta = (double)lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array._4_8_ * (double)*pfVar18 * beta;
            gamma = (double)lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array._4_8_ * (double)*pfVar19 * gamma;
            _pixel_index_col =
                 (double)lambda.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array._4_8_ * (double)*(float *)alpha_plane._8_8_ *
                 _pixel_index_col;
          }
          local_1c8 = (float)beta;
          local_1cc = (float)gamma;
          local_1d0 = (float)_pixel_index_col;
          Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<float,_3,_1,_0,_3,_1> *)local_1c4,&local_1c8,&local_1cc,&local_1d0);
          Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)&v_over_z);
          bVar8 = std::optional::operator_cast_to_bool((optional *)boundingBox._8_8_);
          if (bVar8) {
            one_over_z = -((float)local_90._0_4_ * x_00 + (float)local_90._4_4_ * y_00 +
                          alpha_plane.b) * fVar30;
            one_over_squared_one_over_z =
                 -((float)local_d0._0_4_ * x_00 + (float)local_d0._4_4_ * y_00 + beta_plane.b) *
                 fVar31;
            dudx = -((float)local_110._0_4_ * x_00 + (float)local_110._4_4_ * y_00 + gamma_plane.b)
                   * fVar32;
            _Var37 = std::pow<float,int>(dudx,2);
            dudy = (float)(1.0 / _Var37);
            dvdx = dudy * (fVar11 * fVar30 * dudx + -(one_over_z * fVar13 * fVar32));
            dvdy = dudy * (fVar12 * fVar31 * dudx + -(one_over_squared_one_over_z * fVar13 * fVar32)
                          );
            local_204 = dudy * (fVar14 * fVar30 * dudx + -(one_over_z * fVar16 * fVar32));
            local_208 = dudy * (fVar15 * fVar31 * dudx +
                               -(one_over_squared_one_over_z * fVar16 * fVar32));
            pTVar24 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar25 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar24->mipmaps,0);
            iVar17 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar25);
            dvdx = (float)iVar17 * dvdx;
            pTVar24 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar25 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar24->mipmaps,0);
            iVar17 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar25);
            dvdy = (float)iVar17 * dvdy;
            pTVar24 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar25 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar24->mipmaps,0);
            iVar17 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar25);
            local_204 = (float)iVar17 * local_204;
            pTVar24 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar25 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar24->mipmaps,0);
            iVar17 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar25);
            local_208 = (float)iVar17 * local_208;
            TexturingFragmentShader::shade_triangle_pixel<float>
                      ((TexturingFragmentShader *)&local_218,(int)this,(int)x_00,
                       (Vertex<float> *)(ulong)(uint)(int)y_00,point_a,point_b,
                       (Vector3<float> *)point_c,(optional<eos::render::Texture> *)local_1c4,dvdx,
                       dvdy,local_204,local_208);
            Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                      ((Matrix<float,_4,_1,_0,_4,_1> *)&v_over_z,&local_218);
          }
          else {
            TexturingFragmentShader::shade_triangle_pixel<float>
                      ((TexturingFragmentShader *)local_228,(int)this,(int)x_00,
                       (Vertex<float> *)(ulong)(uint)(int)y_00,point_a,point_b,
                       (Vector3<float> *)point_c,(optional<eos::render::Texture> *)local_1c4,0.0,0.0
                       ,0.0,0.0);
            Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
                      ((Matrix<float,_4,_1,_0,_4,_1> *)&v_over_z,
                       (Matrix<float,_4,_1,_0,_4,_1> *)local_228);
          }
          pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)&v_over_z,
                               0);
          local_230 = 1.0;
          pfVar27 = std::min<float>(pSVar26,&local_230);
          green = (uchar)(int)(*pfVar27 * 255.0);
          pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)&v_over_z,
                               1);
          local_238 = 1.0;
          pfVar27 = std::min<float>(pSVar26,&local_238);
          blue = (uchar)(int)(*pfVar27 * 255.0);
          pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)&v_over_z,
                               2);
          local_240 = 1.0;
          pfVar27 = std::min<float>(pSVar26,&local_240);
          alpha_1 = (uchar)(int)(*pfVar27 * 255.0);
          pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)&v_over_z,
                               3);
          local_248 = 1.0;
          pfVar27 = std::min<float>(pSVar26,&local_248);
          uVar4 = alpha_1;
          local_241 = (uchar)(int)(*pfVar27 * 255.0);
          pPVar28 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)x,(int)y);
          puVar29 = core::Pixel<unsigned_char,_4>::operator[](pPVar28,0);
          uVar5 = blue;
          *puVar29 = uVar4;
          pPVar28 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)x,(int)y);
          puVar29 = core::Pixel<unsigned_char,_4>::operator[](pPVar28,1);
          uVar6 = green;
          *puVar29 = uVar5;
          pPVar28 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)x,(int)y);
          puVar29 = core::Pixel<unsigned_char,_4>::operator[](pPVar28,2);
          uVar4 = local_241;
          *puVar29 = uVar6;
          pPVar28 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)x,(int)y);
          puVar29 = core::Pixel<unsigned_char,_4>::operator[](pPVar28,3);
          *puVar29 = uVar4;
          if ((this->enable_depth_test & 1U) != 0) {
            pdVar23 = core::Image<double>::operator()(&this->depthbuffer,(int)x,(int)y);
            *pdVar23 = dVar33;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }